

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericvar.cpp
# Opt level: O0

double __thiscall MetaSim::GenericVar::get(GenericVar *this)

{
  double dVar1;
  bool bVar2;
  pointer ppVar3;
  undefined8 uVar4;
  iterator i;
  double CDF;
  double v;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  allocator *paVar5;
  _Rb_tree_iterator<std::pair<const_int,_double>_> *in_stack_ffffffffffffff48;
  UniformVar *in_stack_ffffffffffffff50;
  allocator local_91;
  string local_90 [32];
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  Exc *in_stack_ffffffffffffffa0;
  string local_58 [32];
  _Base_ptr local_38;
  _Self local_30;
  _Base_ptr local_28;
  _Rb_tree_iterator<std::pair<const_int,_double>_> local_20;
  double local_18;
  double local_10;
  
  std::_Rb_tree_iterator<std::pair<const_int,_double>_>::_Rb_tree_iterator(&local_20);
  local_10 = UniformVar::get(in_stack_ffffffffffffff50);
  local_18 = 0.0;
  local_28 = (_Base_ptr)
             std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             begin(in_stack_ffffffffffffff38);
  local_20._M_node = local_28;
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::end
                   (in_stack_ffffffffffffff38);
    bVar2 = std::operator!=(&local_20,&local_30);
    dVar1 = local_18;
    if (!bVar2) {
      uVar4 = __cxa_allocate_exception(0x30);
      paVar5 = (allocator *)&stack0xffffffffffffffa7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_58,"Panic",paVar5);
      paVar5 = &local_91;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,"GenericVar",paVar5);
      RandomVar::Exc::Exc(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                          in_stack_ffffffffffffff90);
      __cxa_throw(uVar4,&RandomVar::Exc::typeinfo,RandomVar::Exc::~Exc);
    }
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_double>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_double>_> *)0x202f4b);
    local_18 = dVar1 + ppVar3->second;
    if (local_10 < local_18) break;
    local_38 = (_Base_ptr)
               std::_Rb_tree_iterator<std::pair<const_int,_double>_>::operator++
                         (in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20))
    ;
  }
  ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_double>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_int,_double>_> *)0x202f80);
  return (double)ppVar3->first;
}

Assistant:

double GenericVar::get()
    {
        double v, CDF;
        map<int, double>::iterator i;

        v = UniformVar::get();
        CDF = 0;

        for(i = _pdf.begin(); i != _pdf.end(); i++) {
            CDF = CDF + i->second;
            if (CDF > v) {
                return i->first;
            }
        }

        /* We cannot arrive here... */
        /* It means that v > 1 or that lim_{i -> \infty} CDF < 1... */
        throw Exc("Panic", "GenericVar");
    }